

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gest_matrix.cpp
# Opt level: O1

void ScalarTimesMatrix(double s,Matrix m,Matrix product)

{
  double *pdVar1;
  double *pdVar2;
  ulong uVar3;
  ulong uVar4;
  
  if ((*(char *)((long)m + -7) == *(char *)((long)product + -7)) &&
     (*(char *)((long)m + -6) == *(char *)((long)product + -6))) {
    if (*(char *)((long)m + -7) != '\0') {
      uVar3 = 0;
      do {
        if (*(char *)((long)m + -6) != '\0') {
          pdVar1 = m[uVar3];
          pdVar2 = product[uVar3];
          uVar4 = 0;
          do {
            pdVar2[uVar4] = pdVar1[uVar4] * s;
            uVar4 = uVar4 + 1;
          } while (uVar4 < *(byte *)((long)m + -6));
        }
        uVar3 = uVar3 + 1;
      } while (uVar3 < *(byte *)((long)m + -7));
    }
    return;
  }
  Am_Error("ScalarTimesMatrix");
}

Assistant:

void
ScalarTimesMatrix(double s, Matrix m, Matrix product)
{
  int i, j;

  if (NROWS(m) != NROWS(product) || NCOLS(m) != NCOLS(product))
    Am_Error("ScalarTimesMatrix"); //: result wrong size (%d!=%d)or(%d!=%d)",
  //NROWS(m), NROWS(product),
  //NCOLS(m), NCOLS(product));

  for (i = 0; i < NROWS(m); i++)
    for (j = 0; j < NCOLS(m); j++)
      product[i][j] = s * m[i][j];
}